

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvSensRhsWrapper(CVodeMem cv_mem,sunrealtype time,N_Vector ycur,N_Vector fcur,N_Vector *yScur,
                    N_Vector *fScur,N_Vector temp1,N_Vector temp2)

{
  int iVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_stack_00000008;
  int is;
  int retval;
  int local_48;
  int local_44;
  
  if (*(int *)(in_RDI + 0xb4) == 2) {
    local_44 = (**(code **)(in_RDI + 0x98))
                         (in_XMM0_Qa,*(undefined4 *)(in_RDI + 0x90),in_RSI,in_RDX,in_RCX,in_R8,
                          *(undefined8 *)(in_RDI + 0xa8));
    *(long *)(in_RDI + 0x640) = *(long *)(in_RDI + 0x640) + 1;
  }
  else {
    for (local_48 = 0; local_44 = 0, local_48 < *(int *)(in_RDI + 0x90); local_48 = local_48 + 1) {
      iVar1 = (**(code **)(in_RDI + 0xa0))
                        (in_XMM0_Qa,*(undefined4 *)(in_RDI + 0x90),in_RSI,in_RDX,local_48,
                         *(undefined8 *)(in_RCX + (long)local_48 * 8),
                         *(undefined8 *)(in_R8 + (long)local_48 * 8),*(undefined8 *)(in_RDI + 0xa8),
                         in_R9,in_stack_00000008);
      *(long *)(in_RDI + 0x640) = *(long *)(in_RDI + 0x640) + 1;
      if (iVar1 != 0) {
        return iVar1;
      }
    }
  }
  return local_44;
}

Assistant:

int cvSensRhsWrapper(CVodeMem cv_mem, sunrealtype time, N_Vector ycur,
                     N_Vector fcur, N_Vector* yScur, N_Vector* fScur,
                     N_Vector temp1, N_Vector temp2)
{
  int retval = 0, is;

  if (cv_mem->cv_ifS == CV_ALLSENS)
  {
    retval = cv_mem->cv_fS(cv_mem->cv_Ns, time, ycur, fcur, yScur, fScur,
                           cv_mem->cv_fS_data, temp1, temp2);
    cv_mem->cv_nfSe++;
  }
  else
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      retval = cv_mem->cv_fS1(cv_mem->cv_Ns, time, ycur, fcur, is, yScur[is],
                              fScur[is], cv_mem->cv_fS_data, temp1, temp2);
      cv_mem->cv_nfSe++;
      if (retval != 0) { break; }
    }
  }

  return (retval);
}